

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatHexUInt32_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uint32_t value)

{
  void *pvVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  uint32_t value_local;
  
  ss._388_4_ = SUB84(this,0);
  std::__cxx11::stringstream::stringstream(local_1a0);
  pvVar1 = (void *)std::ostream::operator<<(&ss.field_0x8,std::hex);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::uppercase);
  std::ostream::operator<<(pvVar1,ss._388_4_);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatHexUInt32(uint32_t value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}